

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

void __thiscall
cs::domain_manager::add_var_no_return<cs::var_id_const&>(domain_manager *this,var_id *name,var *val)

{
  bool bVar1;
  domain_type *pdVar2;
  runtime_error *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (*this->fiber_stack == (stack_type<cs::domain_type,_std::allocator> *)0x0) {
    pdVar2 = stack_type<cs::domain_type,_std::allocator>::top(&this->m_data);
    bVar1 = domain_type::add_var_optimal(pdVar2,name,val,false);
    if (!bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&bStack_78,(string *)&name->m_id);
      std::operator+(&local_58,"Target domain exist variable \"",&bStack_78);
      std::operator+(&local_38,&local_58,"\".");
      runtime_error::runtime_error(prVar3,&local_38);
      __cxa_throw(prVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  else {
    pdVar2 = stack_type<cs::domain_type,_std::allocator>::top(*this->fiber_stack);
    bVar1 = domain_type::add_var_optimal(pdVar2,name,val,false);
    if (!bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&bStack_78,(string *)&name->m_id);
      std::operator+(&local_58,"Target domain exist variable \"",&bStack_78);
      std::operator+(&local_38,&local_58,"\".");
      runtime_error::runtime_error(prVar3,&local_38);
      __cxa_throw(prVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void add_var_no_return(T &&name, const var &val)
		{
			if (fiber_stack != nullptr) {
				if (!fiber_stack->top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			else {
				if (!m_data.top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
		}